

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
* __thiscall
nlohmann::detail::
json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
::handle_value<bool&>
          (json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
           *this,bool *v)

{
  bool bVar1;
  char *pcVar2;
  value_t *pvVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_18;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    bVar1 = *v;
    pvVar3 = *(value_t **)this;
    local_18.m_type = *pvVar3;
    *pvVar3 = boolean;
    local_18.m_value = *(json_value *)(pvVar3 + 8);
    *(ulong *)(pvVar3 + 8) = (ulong)bVar1;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_18);
    pbVar4 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               **)this;
  }
  else {
    pcVar2 = *(char **)(*(long *)(this + 0x10) + -8);
    if (*pcVar2 == '\x02') {
      std::
      vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
      ::emplace_back<bool&>
                (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                   **)(pcVar2 + 8),v);
      pbVar4 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)(*(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + -8) + 8) + 8) + -0x10);
    }
    else {
      bVar1 = *v;
      pvVar3 = *(value_t **)(this + 0x20);
      local_28.m_type = *pvVar3;
      *pvVar3 = boolean;
      local_28.m_value = *(json_value *)(pvVar3 + 8);
      *(ulong *)(pvVar3 + 8) = (ulong)bVar1;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_28);
      pbVar4 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)(this + 0x20);
    }
  }
  return pbVar4;
}

Assistant:

BasicJsonType* handle_value(Value&& v)
    {
        if (ref_stack.empty())
        {
            root = BasicJsonType(std::forward<Value>(v));
            return &root;
        }
        else
        {
            assert(ref_stack.back()->is_array() or ref_stack.back()->is_object());
            if (ref_stack.back()->is_array())
            {
                ref_stack.back()->m_value.array->emplace_back(std::forward<Value>(v));
                return &(ref_stack.back()->m_value.array->back());
            }
            else
            {
                assert(object_element);
                *object_element = BasicJsonType(std::forward<Value>(v));
                return object_element;
            }
        }
    }